

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::Instruction::GetSingleWordOperand(Instruction *this,uint32_t index)

{
  Operand *pOVar1;
  size_t sVar2;
  uint *puVar3;
  OperandData *words;
  uint32_t index_local;
  Instruction *this_local;
  
  pOVar1 = GetOperand(this,index);
  sVar2 = utils::SmallVector<unsigned_int,_2UL>::size(&pOVar1->words);
  if (sVar2 != 1) {
    __assert_fail("words.size() == 1 && \"expected the operand only taking one word\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp"
                  ,0xb3,"uint32_t spvtools::opt::Instruction::GetSingleWordOperand(uint32_t) const")
    ;
  }
  puVar3 = utils::SmallVector<unsigned_int,_2UL>::front(&pOVar1->words);
  return *puVar3;
}

Assistant:

uint32_t Instruction::GetSingleWordOperand(uint32_t index) const {
  const auto& words = GetOperand(index).words;
  assert(words.size() == 1 && "expected the operand only taking one word");
  return words.front();
}